

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_se.c
# Opt level: O3

int h264_sub_mb_type(bitstream *str,h264_cabac_context *cabac,uint32_t slice_type,uint32_t *val)

{
  int iVar1;
  uint uVar2;
  h264_cabac_se_val *tab;
  uint uVar3;
  uint uVar4;
  int bidx [3];
  uint32_t local_28 [4];
  
  if (cabac == (h264_cabac_context *)0x0) {
    uVar3 = 4;
    uVar4 = 0;
    if ((slice_type != 0) && (uVar4 = 0, slice_type != 3)) {
      if (slice_type != 1) {
        h264_sub_mb_type_cold_3();
        return 1;
      }
      uVar3 = 0x11;
      uVar4 = 4;
    }
    local_28[0] = *val - uVar4;
    iVar1 = vs_ue(str,local_28);
    if (iVar1 == 0) {
      uVar2 = local_28[0] + uVar4;
      *val = uVar2;
      if ((uVar4 <= uVar2) && (uVar2 < uVar3)) {
        return 0;
      }
      h264_sub_mb_type_cold_2();
      return 1;
    }
    return 1;
  }
  if (slice_type != 3) {
    if (slice_type == 1) {
      local_28[0] = 0x24;
      local_28[1] = 0x25;
      local_28[2] = 0x26;
      local_28[3] = 0x27;
      tab = sub_mb_type_b;
      goto LAB_0010bc2e;
    }
    if (slice_type != 0) {
      h264_sub_mb_type_cold_1();
      return 1;
    }
  }
  local_28[0] = 0x15;
  local_28[1] = 0x16;
  local_28[2] = 0x17;
  tab = sub_mb_type_p;
LAB_0010bc2e:
  iVar1 = h264_cabac_se(str,cabac,tab,(int *)local_28,val);
  return iVar1;
}

Assistant:

int h264_sub_mb_type(struct bitstream *str, struct h264_cabac_context *cabac, uint32_t slice_type, uint32_t *val) {
	if (!cabac) {
		int rbase = 0, rend = 0;
		switch (slice_type) {
			case H264_SLICE_TYPE_P:
			case H264_SLICE_TYPE_SP:
				rbase = H264_SUB_MB_TYPE_P_BASE;
				rend = H264_SUB_MB_TYPE_P_END;
				break;
			case H264_SLICE_TYPE_B:
				rbase = H264_SUB_MB_TYPE_B_BASE;
				rend = H264_SUB_MB_TYPE_B_END;
				break;
			default:
				fprintf(stderr, "sub_mb_type requested for invalid slice type\n");
				return 1;
		}
		uint32_t tmp = *val - rbase;
		if (vs_ue(str, &tmp))
			return 1;
		*val = tmp + rbase;
		if (*val < rbase || *val >= rend) {
			fprintf(stderr, "Invalid sub_mb_type for this slice_type\n");
			return 1;
		}
		return 0;
	} else {
		if (slice_type == H264_SLICE_TYPE_P || slice_type == H264_SLICE_TYPE_SP) {
			int bidx[3] = {
				H264_CABAC_CTXIDX_SUB_MB_TYPE_P + 0,
				H264_CABAC_CTXIDX_SUB_MB_TYPE_P + 1,
				H264_CABAC_CTXIDX_SUB_MB_TYPE_P + 2,
			};
			return h264_cabac_se(str, cabac, sub_mb_type_p, bidx, val);
		} else if (slice_type == H264_SLICE_TYPE_B) {
			int bidx[4] = {
				H264_CABAC_CTXIDX_SUB_MB_TYPE_B + 0,
				H264_CABAC_CTXIDX_SUB_MB_TYPE_B + 1,
				H264_CABAC_CTXIDX_SUB_MB_TYPE_B + 2,
				H264_CABAC_CTXIDX_SUB_MB_TYPE_B + 3,
			};
			return h264_cabac_se(str, cabac, sub_mb_type_b, bidx, val);
		} else {
			fprintf(stderr, "sub_mb_type requested for invalid slice type\n");
			return 1;
		}
	}
}